

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void mspace_free(mspace msp,void *mem)

{
  long *plVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong *puVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong *puVar12;
  int iVar13;
  ulong *puVar14;
  long lVar15;
  ulong *puVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong *puVar20;
  
  if (mem == (void *)0x0) {
    return;
  }
  puVar20 = (ulong *)((long)mem + -0x10);
  puVar14 = *(ulong **)((long)msp + 0x18);
  if ((puVar20 < puVar14) || (uVar11 = *(ulong *)((long)mem + -8), ((uint)uVar11 & 3) == 1))
  goto LAB_00102e35;
  uVar19 = uVar11 & 0xfffffffffffffff8;
  puVar12 = (ulong *)((long)puVar20 + uVar19);
  if ((uVar11 & 1) == 0) {
    uVar5 = *puVar20;
    if ((uVar11 & 2) == 0) {
      uVar19 = uVar19 + uVar5 + 0x20;
      iVar4 = munmap((void *)((long)puVar20 - uVar5),uVar19);
      iVar13 = 2;
      if (iVar4 == 0) {
        *(long *)((long)msp + 0x358) = *(long *)((long)msp + 0x358) - uVar19;
      }
    }
    else {
      puVar20 = (ulong *)((long)puVar20 - uVar5);
      uVar19 = uVar19 + uVar5;
      if (puVar14 <= puVar20) {
        if (puVar20 == *(ulong **)((long)msp + 0x20)) {
          uVar11 = puVar12[1];
          if ((~(uint)uVar11 & 3) == 0) {
            *(ulong *)((long)msp + 8) = uVar19;
            puVar12[1] = uVar11 & 0xfffffffffffffffe;
            puVar20[1] = uVar19 | 1;
            *puVar12 = uVar19;
            iVar13 = 2;
            goto LAB_00102884;
          }
        }
        else {
          if (0xff < uVar5) {
            puVar7 = (ulong *)puVar20[3];
            uVar11 = puVar20[6];
            if (puVar7 == puVar20) {
              puVar7 = (ulong *)puVar20[5];
              if (puVar7 != (ulong *)0x0) {
                puVar6 = puVar20 + 5;
LAB_00102c48:
                do {
                  if (puVar7[5] == 0) {
                    if (puVar7[4] == 0) goto code_r0x00102c5c;
                    puVar6 = puVar7 + 4;
                  }
                  else {
                    puVar6 = puVar7 + 5;
                  }
                  puVar7 = (ulong *)*puVar6;
                } while( true );
              }
              puVar7 = (ulong *)puVar20[4];
              if (puVar7 != (ulong *)0x0) {
                puVar6 = puVar20 + 4;
                goto LAB_00102c48;
              }
              puVar7 = (ulong *)0x0;
            }
            else {
              puVar6 = (ulong *)puVar20[2];
              if (((puVar6 < puVar14) || ((ulong *)puVar6[3] != puVar20)) ||
                 ((ulong *)puVar7[2] != puVar20)) goto LAB_00102e35;
              puVar6[3] = (ulong)puVar7;
              puVar7[2] = (ulong)puVar6;
            }
            goto LAB_00102c6c;
          }
          puVar7 = (ulong *)puVar20[2];
          puVar6 = (ulong *)puVar20[3];
          puVar16 = (ulong *)((long)msp + (uVar5 >> 3) * 0x10 + 0x48);
          if ((puVar7 != puVar16) && ((puVar7 < puVar14 || ((ulong *)puVar7[3] != puVar20))))
          goto LAB_00102e35;
          if (puVar6 == puVar7) {
            bVar8 = (byte)(uVar5 >> 3) & 0x1f;
            *(uint *)msp = *msp & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
          }
          else {
            if ((puVar6 != puVar16) && ((puVar6 < puVar14 || ((ulong *)puVar6[2] != puVar20))))
            goto LAB_00102e35;
            puVar7[3] = (ulong)puVar6;
            puVar6[2] = (ulong)puVar7;
          }
        }
        bVar3 = true;
        iVar13 = 0;
        goto LAB_001028e6;
      }
      iVar13 = 5;
    }
LAB_00102884:
    bVar3 = false;
    goto LAB_001028e6;
  }
LAB_001028ee:
  iVar13 = 0;
  if ((puVar20 < puVar12) && (uVar11 = puVar12[1], (uVar11 & 1) != 0)) {
    if ((uVar11 & 2) != 0) {
      puVar12[1] = uVar11 & 0xfffffffffffffffe;
      puVar20[1] = uVar19 | 1;
      *(ulong *)((long)puVar20 + uVar19) = uVar19;
      goto LAB_001029b0;
    }
    if (puVar12 == *(ulong **)((long)msp + 0x28)) {
      uVar19 = uVar19 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar19;
      *(ulong **)((long)msp + 0x28) = puVar20;
      puVar20[1] = uVar19 | 1;
      if (puVar20 == *(ulong **)((long)msp + 0x20)) {
        *(undefined8 *)((long)msp + 0x20) = 0;
        *(undefined8 *)((long)msp + 8) = 0;
      }
      iVar13 = 2;
      if (*(ulong *)((long)msp + 0x30) < uVar19) {
        sys_trim((mstate)msp,0);
      }
      goto LAB_00102e19;
    }
    if (puVar12 != *(ulong **)((long)msp + 0x20)) {
      if (0xff < uVar11) {
        puVar14 = (ulong *)puVar12[3];
        uVar5 = puVar12[6];
        if (puVar14 == puVar12) {
          puVar14 = (ulong *)puVar12[5];
          if (puVar14 != (ulong *)0x0) {
            puVar7 = puVar12 + 5;
LAB_00102d31:
            do {
              if (puVar14[5] == 0) {
                if (puVar14[4] == 0) goto code_r0x00102d45;
                puVar7 = puVar14 + 4;
              }
              else {
                puVar7 = puVar14 + 5;
              }
              puVar14 = (ulong *)*puVar7;
            } while( true );
          }
          puVar14 = (ulong *)puVar12[4];
          if (puVar14 != (ulong *)0x0) {
            puVar7 = puVar12 + 4;
            goto LAB_00102d31;
          }
          puVar14 = (ulong *)0x0;
        }
        else {
          uVar2 = puVar12[2];
          if (((uVar2 < *(ulong *)((long)msp + 0x18)) || (*(ulong **)(uVar2 + 0x18) != puVar12)) ||
             ((ulong *)puVar14[2] != puVar12)) goto LAB_00102e35;
          *(ulong **)(uVar2 + 0x18) = puVar14;
          puVar14[2] = uVar2;
        }
        goto LAB_00102d56;
      }
      uVar5 = puVar12[2];
      uVar2 = puVar12[3];
      uVar17 = (long)msp + (uVar11 >> 3) * 0x10 + 0x48;
      if ((uVar5 != uVar17) &&
         ((uVar5 < *(ulong *)((long)msp + 0x18) || (*(ulong **)(uVar5 + 0x18) != puVar12))))
      goto LAB_00102e35;
      if (uVar2 == uVar5) {
        bVar8 = (byte)(uVar11 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
      }
      else {
        if ((uVar2 != uVar17) &&
           ((uVar2 < *(ulong *)((long)msp + 0x18) || (*(ulong **)(uVar2 + 0x10) != puVar12))))
        goto LAB_00102e35;
        *(ulong *)(uVar5 + 0x18) = uVar2;
        *(ulong *)(uVar2 + 0x10) = uVar5;
      }
      goto LAB_00102de6;
    }
    uVar19 = uVar19 + *(long *)((long)msp + 8);
    *(ulong *)((long)msp + 8) = uVar19;
    *(ulong **)((long)msp + 0x20) = puVar20;
    puVar20[1] = uVar19 | 1;
    *(ulong *)((long)puVar20 + uVar19) = uVar19;
LAB_00102aad:
    iVar13 = 2;
  }
LAB_00102e19:
  if (iVar13 == 2) {
    return;
  }
LAB_00102e35:
  abort();
code_r0x00102c5c:
  if (puVar6 < puVar14) goto LAB_00102e35;
  *puVar6 = 0;
LAB_00102c6c:
  iVar4 = 0;
  bVar3 = true;
  iVar13 = 0;
  if (uVar11 != 0) {
    uVar10 = (uint)puVar20[7];
    iVar13 = iVar4;
    if (puVar20 == *(ulong **)((long)msp + (ulong)uVar10 * 8 + 600)) {
      *(ulong **)((long)msp + (ulong)uVar10 * 8 + 600) = puVar7;
      if (puVar7 == (ulong *)0x0) {
        bVar8 = (byte)uVar10 & 0x1f;
        *(uint *)((long)msp + 4) =
             *(uint *)((long)msp + 4) & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
        goto LAB_00102cba;
      }
    }
    else {
      if (uVar11 < *(ulong *)((long)msp + 0x18)) goto LAB_00102e35;
      if (*(ulong **)(uVar11 + 0x20) == puVar20) {
        *(ulong **)(uVar11 + 0x20) = puVar7;
      }
      else {
        *(ulong **)(uVar11 + 0x28) = puVar7;
      }
LAB_00102cba:
      if (puVar7 == (ulong *)0x0) goto LAB_001028e6;
    }
    puVar14 = *(ulong **)((long)msp + 0x18);
    if (puVar7 < puVar14) goto LAB_00102e35;
    puVar7[6] = uVar11;
    puVar6 = (ulong *)puVar20[4];
    if (puVar6 != (ulong *)0x0) {
      if (puVar6 < puVar14) goto LAB_00102e35;
      puVar7[4] = (ulong)puVar6;
      puVar6[6] = (ulong)puVar7;
    }
    uVar11 = puVar20[5];
    if (uVar11 != 0) {
      if (uVar11 < *(ulong *)((long)msp + 0x18)) goto LAB_00102e35;
      puVar7[5] = uVar11;
      *(ulong **)(uVar11 + 0x30) = puVar7;
    }
  }
LAB_001028e6:
  if (bVar3) goto LAB_001028ee;
  goto LAB_00102e19;
code_r0x00102d45:
  if (puVar7 < *(ulong **)((long)msp + 0x18)) goto LAB_00102e35;
  *puVar7 = 0;
LAB_00102d56:
  if (uVar5 != 0) {
    uVar10 = (uint)puVar12[7];
    if (puVar12 == *(ulong **)((long)msp + (ulong)uVar10 * 8 + 600)) {
      *(ulong **)((long)msp + (ulong)uVar10 * 8 + 600) = puVar14;
      if (puVar14 == (ulong *)0x0) {
        bVar8 = (byte)uVar10 & 0x1f;
        *(uint *)((long)msp + 4) =
             *(uint *)((long)msp + 4) & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
        goto LAB_00102da1;
      }
    }
    else {
      if (uVar5 < *(ulong *)((long)msp + 0x18)) goto LAB_00102e35;
      if (*(ulong **)(uVar5 + 0x20) == puVar12) {
        *(ulong **)(uVar5 + 0x20) = puVar14;
      }
      else {
        *(ulong **)(uVar5 + 0x28) = puVar14;
      }
LAB_00102da1:
      if (puVar14 == (ulong *)0x0) goto LAB_00102de6;
    }
    puVar7 = *(ulong **)((long)msp + 0x18);
    if (puVar14 < puVar7) goto LAB_00102e35;
    puVar14[6] = uVar5;
    puVar6 = (ulong *)puVar12[4];
    if (puVar6 != (ulong *)0x0) {
      if (puVar6 < puVar7) goto LAB_00102e35;
      puVar14[4] = (ulong)puVar6;
      puVar6[6] = (ulong)puVar14;
    }
    uVar5 = puVar12[5];
    if (uVar5 != 0) {
      if (uVar5 < *(ulong *)((long)msp + 0x18)) goto LAB_00102e35;
      puVar14[5] = uVar5;
      *(ulong **)(uVar5 + 0x30) = puVar14;
    }
  }
LAB_00102de6:
  uVar19 = (uVar11 & 0xfffffffffffffff8) + uVar19;
  puVar20[1] = uVar19 | 1;
  *(ulong *)((long)puVar20 + uVar19) = uVar19;
  if (puVar20 == *(ulong **)((long)msp + 0x20)) {
    *(ulong *)((long)msp + 8) = uVar19;
    iVar13 = 2;
  }
  else {
LAB_001029b0:
    if (uVar19 < 0x100) {
      uVar19 = uVar19 >> 3;
      uVar11 = (long)msp + uVar19 * 0x10 + 0x48;
      if ((*msp >> ((uint)uVar19 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar19 & 0x1f);
        uVar5 = uVar11;
      }
      else {
        uVar5 = *(ulong *)((long)msp + uVar19 * 0x10 + 0x58);
        if (uVar5 < *(ulong *)((long)msp + 0x18)) goto LAB_00102e35;
      }
      *(ulong **)((long)msp + uVar19 * 0x10 + 0x58) = puVar20;
      *(ulong **)(uVar5 + 0x18) = puVar20;
      puVar20[2] = uVar5;
      puVar20[3] = uVar11;
      goto LAB_00102aad;
    }
    uVar10 = (uint)(uVar19 >> 8);
    if (uVar10 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0x1f;
      if (uVar10 < 0x10000) {
        uVar9 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar9 = (uint)((uVar19 >> ((ulong)(byte)(0x26 - (char)(uVar9 ^ 0x1f)) & 0x3f) & 1) != 0) +
                (uVar9 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    puVar14 = (ulong *)((long)msp + (ulong)uVar9 * 8 + 600);
    *(uint *)(puVar20 + 7) = uVar9;
    puVar20[4] = 0;
    puVar20[5] = 0;
    if ((*(uint *)((long)msp + 4) >> (uVar9 & 0x1f) & 1) == 0) {
      *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar9 & 0x1f);
      lVar15 = 0x10;
      lVar18 = 0x30;
      puVar12 = puVar20;
      puVar7 = puVar14;
      puVar6 = puVar20;
LAB_00102b9b:
      *puVar7 = (ulong)puVar20;
      *(ulong **)((long)puVar20 + lVar18) = puVar14;
      puVar20[3] = (ulong)puVar12;
      *(ulong **)((long)puVar20 + lVar15) = puVar6;
    }
    else {
      puVar12 = (ulong *)*puVar14;
      bVar8 = 0x39 - (char)(uVar9 >> 1);
      if (uVar9 == 0x1f) {
        bVar8 = 0;
      }
      lVar15 = uVar19 << (bVar8 & 0x3f);
      do {
        if ((puVar12[1] & 0xfffffffffffffff8) == uVar19) {
          if ((puVar12 < *(ulong **)((long)msp + 0x18)) ||
             (puVar14 = (ulong *)puVar12[2], puVar14 < *(ulong **)((long)msp + 0x18)))
          goto LAB_00102e35;
          puVar14[3] = (ulong)puVar20;
          lVar15 = 0x30;
          lVar18 = 0x10;
          puVar7 = puVar12 + 2;
          puVar6 = (ulong *)0x0;
          goto LAB_00102b9b;
        }
        puVar14 = (ulong *)puVar12[4 - (lVar15 >> 0x3f)];
        puVar7 = puVar14;
        if (puVar14 == (ulong *)0x0) {
          if (puVar12 + (4 - (lVar15 >> 0x3f)) < *(ulong **)((long)msp + 0x18)) goto LAB_00102e35;
          puVar12[4 - (lVar15 >> 0x3f)] = (ulong)puVar20;
          puVar20[6] = (ulong)puVar12;
          puVar20[3] = (ulong)puVar20;
          puVar20[2] = (ulong)puVar20;
          puVar7 = puVar12;
        }
        puVar12 = puVar7;
        lVar15 = lVar15 * 2;
      } while (puVar14 != (ulong *)0x0);
    }
    plVar1 = (long *)((long)msp + 0x38);
    *plVar1 = *plVar1 + -1;
    iVar13 = 2;
    if (*plVar1 == 0) {
      release_unused_segments((mstate)msp);
    }
  }
  goto LAB_00102e19;
}

Assistant:

void mspace_free(mspace msp, void* mem) {
  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    (void)msp; /* placate people compiling -Wunused */
#else /* FOOTERS */
    mstate fm = (mstate)msp;
#endif /* FOOTERS */
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
}